

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O0

void dec_derive_skip_mv_affine(com_core_t *core,int mrg_idx)

{
  int local_70;
  int local_6c;
  int lidx;
  int cp_idx;
  CPMV mrg_list_cp_mv [2] [4] [2];
  int local_1c;
  s8 local_16 [2];
  int mrg_list_cp_num;
  s8 mrg_list_refi [2];
  com_core_t *pcStack_10;
  int mrg_idx_local;
  com_core_t *core_local;
  
  mrg_list_cp_num = mrg_idx;
  pcStack_10 = core;
  get_affine_merge_candidate(core,local_16,(CPMV (*) [4] [2])&lidx,&local_1c,mrg_idx);
  pcStack_10->affine_flag = (char)local_1c + 0xff;
  for (local_70 = 0; local_70 < 2; local_70 = local_70 + 1) {
    if (local_16[local_70] < '\0') {
      pcStack_10->refi[local_70] = -1;
    }
    else {
      pcStack_10->refi[local_70] = local_16[local_70];
      for (local_6c = 0; local_6c < local_1c; local_6c = local_6c + 1) {
        pcStack_10->affine_mv[local_70][local_6c] =
             *(CPMV (*) [2])(&lidx + (long)local_70 * 8 + (long)local_6c * 2);
      }
    }
  }
  return;
}

Assistant:

void dec_derive_skip_mv_affine(com_core_t * core, int mrg_idx)
{
    s8  mrg_list_refi  [REFP_NUM];
    int mrg_list_cp_num;
    CPMV mrg_list_cp_mv[REFP_NUM][VER_NUM][MV_D];
    int cp_idx, lidx;

    get_affine_merge_candidate(core, mrg_list_refi, mrg_list_cp_mv, &mrg_list_cp_num, mrg_idx);
    
    core->affine_flag = mrg_list_cp_num - 1;

    for (lidx = 0; lidx < REFP_NUM; lidx++) {
        if (REFI_IS_VALID(mrg_list_refi[lidx])) {
            core->refi[lidx] = mrg_list_refi[lidx];
            for (cp_idx = 0; cp_idx < mrg_list_cp_num; cp_idx++) {
                CP64(core->affine_mv[lidx][cp_idx], mrg_list_cp_mv[lidx][cp_idx]);
            }
        } else {
            core->refi[lidx] = REFI_INVALID;
        }
    }
}